

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  ushort uVar1;
  sqlite3 *db;
  Vdbe *p;
  Index *pIVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  Index **ppIVar6;
  Parse *pPVar7;
  SrcList *pTabList;
  ExprList *pChanges;
  Expr *pWhere;
  uint uVar8;
  Op *pOVar9;
  int iVar10;
  short *psVar11;
  int p2;
  long lVar12;
  Upsert *pOrderBy;
  ulong uVar13;
  long lVar14;
  Expr *in_stack_00000008;
  Upsert *in_stack_00000010;
  
  db = pParse->db;
  p = pParse->pVdbe;
  iVar5 = pUpsert->iDataCur;
  pOrderBy = pUpsert;
  do {
    if ((pOrderBy->pUpsertTarget == (ExprList *)0x0) || (pOrderBy->pUpsertIdx == pIdx))
    goto LAB_001b205c;
    pOrderBy = pOrderBy->pNextUpsert;
  } while (pOrderBy != (Upsert *)0x0);
  pOrderBy = (Upsert *)0x0;
LAB_001b205c:
  if (iVar5 != iCur && pIdx != (Index *)0x0) {
    if ((pTab->tabFlags & 0x80) == 0) {
      if (pParse->nTempReg == '\0') {
        iVar10 = pParse->nMem + 1;
        pParse->nMem = iVar10;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar10 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p,0x8e,iCur,iVar10,0);
      sqlite3VdbeAddOp3(p,0x1e,iVar5,0,iVar10);
      if (iVar10 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          pParse->nTempReg = bVar3 + 1;
          pParse->aTempReg[bVar3] = iVar10;
        }
      }
    }
    else {
      ppIVar6 = &pTab->pIndex;
      do {
        pIVar2 = *ppIVar6;
        ppIVar6 = &pIVar2->pNext;
      } while ((*(ushort *)&pIVar2->field_0x63 & 3) != 2);
      uVar1 = pIVar2->nKeyCol;
      iVar10 = pParse->nMem + 1;
      uVar8 = (uint)uVar1;
      pParse->nMem = pParse->nMem + uVar8;
      if (uVar1 != 0) {
        uVar13 = 0;
        do {
          p2 = -1;
          if (pIdx->nColumn != 0) {
            psVar11 = pIdx->aiColumn;
            lVar12 = 0;
            do {
              if (*psVar11 == pIVar2->aiColumn[uVar13]) {
                p2 = (int)lVar12 >> 0x10;
                break;
              }
              lVar12 = lVar12 + 0x10000;
              psVar11 = psVar11 + 1;
            } while ((ulong)pIdx->nColumn * 0x10000 != lVar12);
          }
          sqlite3VdbeAddOp3(p,0x5e,iCur,p2,iVar10 + (int)uVar13);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar8);
      }
      iVar5 = sqlite3VdbeAddOp3(p,0x1d,iVar5,0,iVar10);
      if (p->db->mallocFailed == '\0') {
        pOVar9 = p->aOp;
        pOVar9[iVar5].p4type = -3;
        pOVar9[iVar5].p4.i = uVar8;
      }
      iVar10 = sqlite3VdbeAddOp3(p,0x46,0xb,2,0);
      sqlite3VdbeChangeP4(p,iVar10,"corrupt database",-1);
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      pPVar7->mayAbort = '\x01';
      if (p->db->mallocFailed == '\0') {
        pOVar9 = p->aOp + iVar5;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar9->p2 = p->nOp;
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  sVar4 = pTab->nCol;
  if (0 < sVar4) {
    lVar14 = 9;
    lVar12 = 0;
    do {
      if (*(char *)((long)&pTab->aCol->zCnName + lVar14) == 'E') {
        sqlite3VdbeAddOp3(p,0x57,pUpsert->regData + (int)lVar12,0,0);
        sVar4 = pTab->nCol;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0x10;
    } while (lVar12 < sVar4);
  }
  pWhere = (Expr *)0x0;
  pChanges = sqlite3ExprListDup(db,pOrderBy->pUpsertSet,0);
  if (pOrderBy->pUpsertWhere != (Expr *)0x0) {
    pWhere = exprDup(db,pOrderBy->pUpsertWhere,0,(u8 **)0x0);
  }
  sqlite3Update(pParse,pTabList,pChanges,pWhere,2,(ExprList *)pOrderBy,in_stack_00000008,
                in_stack_00000010);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;
  int i;
  Upsert *pTop = pUpsert;

  assert( v!=0 );
  assert( pUpsert!=0 );
  iDataCur = pUpsert->iDataCur;
  pUpsert = sqlite3UpsertOfIndex(pTop, pIdx);
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zCnName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0,
            "corrupt database", P4_STATIC);
      sqlite3MayAbort(pParse);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pTop->pUpsertSrc - the outer INSERT statement does.
  ** So we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pTop->pUpsertSrc, 0);
  /* excluded.* columns of type REAL need to be converted to a hard real */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
      sqlite3VdbeAddOp1(v, OP_RealAffinity, pTop->regData+i);
    }
  }
  sqlite3Update(pParse, pSrc, sqlite3ExprListDup(db,pUpsert->pUpsertSet,0),
      sqlite3ExprDup(db,pUpsert->pUpsertWhere,0), OE_Abort, 0, 0, pUpsert);
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}